

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Iter * fts5MultiIterAlloc(Fts5Index *p,int nSeg)

{
  uint uVar1;
  uint uVar2;
  Fts5Iter *pFVar3;
  
  uVar1 = 2;
  do {
    uVar2 = uVar1;
    uVar1 = uVar2 * 2;
  } while ((int)uVar2 < nSeg);
  pFVar3 = (Fts5Iter *)
           sqlite3Fts5MallocZero(&p->rc,(long)(int)(uVar2 - 1) * 0x78 + (ulong)uVar2 * 4 + 0xd8);
  if (pFVar3 != (Fts5Iter *)0x0) {
    pFVar3->nSeg = uVar2;
    pFVar3->aFirst = (Fts5CResult *)(pFVar3->aSeg + uVar2);
    pFVar3->pIndex = p;
    pFVar3->xSetOutputs = fts5IterSetOutputs_Noop;
  }
  return pFVar3;
}

Assistant:

static Fts5Iter *fts5MultiIterAlloc(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  int nSeg
){
  Fts5Iter *pNew;
  int nSlot;                      /* Power of two >= nSeg */

  for(nSlot=2; nSlot<nSeg; nSlot=nSlot*2);
  pNew = fts5IdxMalloc(p, 
      sizeof(Fts5Iter) +                  /* pNew */
      sizeof(Fts5SegIter) * (nSlot-1) +   /* pNew->aSeg[] */
      sizeof(Fts5CResult) * nSlot         /* pNew->aFirst[] */
  );
  if( pNew ){
    pNew->nSeg = nSlot;
    pNew->aFirst = (Fts5CResult*)&pNew->aSeg[nSlot];
    pNew->pIndex = p;
    pNew->xSetOutputs = fts5IterSetOutputs_Noop;
  }
  return pNew;
}